

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caller.hpp
# Opt level: O3

PyObject * __thiscall
boost::python::detail::caller_arity<4U>::
impl<void_(*)(_object_*,_HighFreqDataType,_int,_HFParsingInfo),_boost::python::default_call_policies,_boost::mpl::vector5<void,__object_*,_HighFreqDataType,_int,_HFParsingInfo>_>
::operator()(impl<void_(*)(_object_*,_HighFreqDataType,_int,_HFParsingInfo),_boost::python::default_call_policies,_boost::mpl::vector5<void,__object_*,_HighFreqDataType,_int,_HFParsingInfo>_>
             *this,PyObject *args_,PyObject *param_2)

{
  _object *p_Var1;
  PyTypeObject *pPVar2;
  PyObject *pPVar3;
  c_t0 c0;
  c_t2 c2;
  c_t3 c3;
  c_t1 c1;
  PyTypeObject *local_158;
  undefined4 local_14c;
  undefined1 local_148 [16];
  PyTypeObject *local_130;
  undefined1 local_128 [16];
  HFParsingInfo local_118;
  _object *local_d8;
  undefined1 local_c8 [16];
  undefined8 *local_b8 [18];
  _object *local_28;
  
  local_158 = args_[1].ob_type;
  p_Var1 = (_object *)args_[2].ob_refcnt;
  local_c8 = converter::rvalue_from_python_stage1
                       (p_Var1,converter::detail::registered_base<HighFreqDataType_const_volatile&>
                               ::converters);
  if (local_c8._0_8_ == 0) {
    return (PyObject *)0x0;
  }
  pPVar2 = args_[2].ob_type;
  local_28 = p_Var1;
  local_148 = converter::rvalue_from_python_stage1
                        ((_object *)pPVar2,
                         converter::detail::registered_base<int_const_volatile&>::converters);
  local_130 = pPVar2;
  if (local_148._0_8_ != 0) {
    p_Var1 = (_object *)args_[3].ob_refcnt;
    local_128 = converter::rvalue_from_python_stage1
                          (p_Var1,converter::detail::registered_base<HFParsingInfo_const_volatile&>
                                  ::converters);
    local_d8 = p_Var1;
    if (local_128._0_8_ != 0) {
      local_14c = 0;
      pPVar3 = invoke<int,void(*)(_object*,HighFreqDataType,int,HFParsingInfo),boost::python::arg_from_python<_object*>,boost::python::arg_from_python<HighFreqDataType>,boost::python::arg_from_python<int>,boost::python::arg_from_python<HFParsingInfo>>
                         (&local_14c,this,&local_158,local_c8,local_148,local_128);
      if ((HFParsingInfo *)local_128._0_8_ == &local_118) {
        value_destroyer<false>::execute<HFParsingInfo>(&local_118);
      }
      goto LAB_00239bef;
    }
  }
  pPVar3 = (PyObject *)0x0;
LAB_00239bef:
  if ((undefined8 **)local_c8._0_8_ == local_b8) {
    (*(code *)*local_b8[0])();
  }
  return pPVar3;
}

Assistant:

PyObject* operator()(PyObject* args_, PyObject*) // eliminate
                                                         // this
                                                         // trailing
                                                         // keyword dict
        {
            typedef typename mpl::begin<Sig>::type first;
            typedef typename first::type result_t;
            typedef typename select_result_converter<Policies, result_t>::type result_converter;
            typedef typename Policies::argument_package argument_package;
            
            argument_package inner_args(args_);

# if N
#  define BOOST_PP_LOCAL_MACRO(i) BOOST_PYTHON_ARG_CONVERTER(i)
#  define BOOST_PP_LOCAL_LIMITS (0, N-1)
#  include BOOST_PP_LOCAL_ITERATE()
# endif 
            // all converters have been checked. Now we can do the
            // precall part of the policy
            if (!m_data.second().precall(inner_args))
                return 0;

            PyObject* result = detail::invoke(
                detail::invoke_tag<result_t,F>()
              , create_result_converter(args_, (result_converter*)0, (result_converter*)0)
              , m_data.first()
                BOOST_PP_ENUM_TRAILING_PARAMS(N, c)
            );
            
            return m_data.second().postcall(inner_args, result);
        }